

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedCompanion.cc
# Opt level: O3

void __thiscall
Glucose::SharedCompanion::addLearnt(SharedCompanion *this,ParallelSolver *s,Lit unary)

{
  Lit local_24;
  
  local_24.x = unary.x;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutexSharedUnitCompanion);
  if (((this->isUnary).data[unary.x >> 1].value & 2) != 0) {
    vec<Glucose::Lit>::push(&this->unitLit,&local_24);
    (this->isUnary).data[local_24.x >> 1].value = (byte)local_24.x & 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutexSharedUnitCompanion);
  return;
}

Assistant:

void SharedCompanion::addLearnt(ParallelSolver *s,Lit unary) {
  pthread_mutex_lock(&mutexSharedUnitCompanion);
  if (isUnary[var(unary)]==l_Undef) {
      unitLit.push(unary);
      isUnary[var(unary)] = sign(unary)?l_False:l_True;
  } 
  pthread_mutex_unlock(&mutexSharedUnitCompanion);
}